

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deTimer.c
# Opt level: O0

void deTimer_disable(deTimer *timer)

{
  undefined1 local_30 [8];
  itimerspec tspec;
  deTimer *timer_local;
  
  tspec.it_interval.tv_nsec = 0;
  tspec.it_value.tv_sec = 0;
  local_30 = (undefined1  [8])0x0;
  tspec.it_interval.tv_sec = 0;
  tspec.it_value.tv_nsec = (__syscall_slong_t)timer;
  timer_settime(timer->timer,0,(itimerspec *)local_30,(itimerspec *)0x0);
  *(undefined4 *)(tspec.it_value.tv_nsec + 0x18) = 0;
  return;
}

Assistant:

void deTimer_disable (deTimer* timer)
{
	struct itimerspec tspec;

	DE_ASSERT(timer);

	tspec.it_value.tv_sec		= 0;
	tspec.it_value.tv_nsec		= 0;
	tspec.it_interval.tv_sec	= 0;
	tspec.it_interval.tv_nsec	= 0;

	timer_settime(timer->timer, 0, &tspec, DE_NULL);

	/* \todo [2012-07-10 pyry] How to wait until all pending callbacks have finished? */

	timer->isActive = DE_FALSE;
}